

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

Material * rw::Material::streamRead(Stream *stream)

{
  undefined4 uVar1;
  FILE *pFVar2;
  bool bVar3;
  Material *this;
  Texture *pTVar4;
  char *pcVar5;
  SurfaceProperties *data;
  uint32 version;
  Error _e;
  int local_28;
  uint32 length;
  Error _e_1;
  
  bVar3 = findChunk(stream,1,(uint32 *)0x0,&version);
  if (!bVar3) {
    _e.plugin = 7;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",0x3a4);
    pFVar2 = _stderr;
    pcVar5 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar2,"%s\n",pcVar5);
    setError(&_e);
    return (Material *)0x0;
  }
  (*stream->_vptr_Stream[4])(stream,&_e,0x10);
  this = create();
  if (this == (Material *)0x0) {
    return (Material *)0x0;
  }
  (this->color).red = (undefined1)_e.code;
  (this->color).green = _e.code._1_1_;
  (this->color).blue = _e.code._2_1_;
  (this->color).alpha = _e.code._3_1_;
  data = &this->surfaceProps;
  if (version < 0x30400) {
    (this->surfaceProps).diffuse = DAT_00144888;
    uVar1 = defaultSurfaceProps._4_4_;
    data->ambient = (float32)(undefined4)defaultSurfaceProps;
    data->specular = (float32)uVar1;
  }
  else {
    Stream::read32(stream,data,0xc);
  }
  if (local_28 != 0) {
    bVar3 = findChunk(stream,6,&length,(uint32 *)0x0);
    if (!bVar3) {
      _e_1.plugin = 7;
      _e_1.code = 0x80000004;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",0x3b5
             );
      pFVar2 = _stderr;
      pcVar5 = dbgsprint(0x80000004,"TEXTURE");
      fprintf(pFVar2,"%s\n",pcVar5);
      setError(&_e_1);
      goto LAB_00108ce5;
    }
    pTVar4 = Texture::streamRead(stream);
    this->texture = pTVar4;
  }
  materialRights = 0;
  bVar3 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
  if (bVar3) {
    if (materialRights != 0) {
      PluginList::assertRights((PluginList *)&s_plglist,this,materialRights,DAT_00145140);
      return this;
    }
    return this;
  }
LAB_00108ce5:
  destroy(this);
  return (Material *)0x0;
}

Assistant:

Material*
Material::streamRead(Stream *stream)
{
	uint32 length, version;
	MatStreamData buf;

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read8(&buf, sizeof(buf));
	RGBA col = buf.color;
	memNative32(&buf, sizeof(buf));
	buf.color = col;
	Material *mat = Material::create();
	if(mat == nil)
		return nil;
	mat->color = buf.color;
	if(version < 0x30400)
		mat->surfaceProps = defaultSurfaceProps;
	else
		stream->read32(&mat->surfaceProps, sizeof(SurfaceProperties));
	if(buf.textured){
		if(!findChunk(stream, ID_TEXTURE, &length, nil)){
			RWERROR((ERR_CHUNK, "TEXTURE"));
			goto fail;
		}
		mat->texture = Texture::streamRead(stream);
	}

	materialRights[0] = 0;
	if(!s_plglist.streamRead(stream, mat))
		goto fail;
	if(materialRights[0])
		s_plglist.assertRights(mat, materialRights[0], materialRights[1]);
	return mat;

fail:
	mat->destroy();
	return nil;
}